

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

int sort_typeBstar(uchar *T,int *SA,int *bucket_A,int *bucket_B,int n,int openMP)

{
  uint *puVar1;
  undefined4 uVar2;
  uint uVar3;
  char cVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int *piVar16;
  ulong uVar17;
  long lVar18;
  uchar *puVar19;
  uint *puVar20;
  ulong uVar21;
  ulong uVar22;
  ushort uVar23;
  byte *pbVar24;
  byte *pbVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  int *piVar30;
  ulong uVar31;
  uint *puVar32;
  uint *puVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  byte *pbVar41;
  uint *puVar42;
  int iVar43;
  ulong uVar44;
  int *piVar45;
  uint *puVar46;
  uint uVar47;
  uint uVar48;
  byte *pbVar49;
  uint uVar50;
  uint uVar51;
  uint *puVar52;
  bool bVar53;
  bool bVar54;
  anon_struct_32_5_90aca025 stack [64];
  int in_stack_fffffffffffff6c0;
  uint local_924;
  uint *local_8f0;
  uchar *local_8e8;
  ulong local_8e0;
  ulong local_8d8;
  uchar *local_8d0;
  int local_8c4;
  uint *local_8c0;
  uint *local_8b8;
  uint *local_8b0;
  uint *local_8a8;
  uint *local_8a0;
  uint local_894;
  uint *local_890;
  uint *local_888;
  ulong local_880;
  ulong local_878;
  ulong local_870;
  int *local_868;
  int *local_860;
  uint *local_858;
  uint *local_850;
  ulong local_848 [5];
  uint auStack_820 [2];
  long alStack_818 [3];
  uint auStack_800 [500];
  
  uVar17 = (ulong)(uint)n;
  iVar26 = 0;
  local_8e8 = T;
  local_860 = bucket_A;
  memset(bucket_A,0,0x400);
  memset(bucket_B,0,0x40000);
  uVar22 = (ulong)(n - 1);
  uVar14 = n;
  if (0 < n) {
    uVar12 = (uint)local_8e8[uVar22];
    uVar29 = uVar22;
    do {
      uVar50 = (uint)uVar29;
      uVar44 = uVar29;
      do {
        uVar48 = uVar12;
        uVar44 = uVar44 - 1;
        uVar47 = (uint)uVar29;
        local_860[uVar48] = local_860[uVar48] + 1;
        uVar13 = (int)uVar50 >> 0x1f & uVar50;
        uVar12 = uVar48;
        if ((int)uVar47 < 1) break;
        uVar12 = (uint)local_8e8[uVar44 & 0xffffffff];
        uVar29 = (ulong)(uVar47 - 1);
        uVar13 = uVar47;
      } while (uVar48 <= uVar12);
      uVar29 = 0xffffffff;
      if (0 < (int)uVar47) {
        bucket_B[uVar12 << 8 | uVar48] = bucket_B[uVar12 << 8 | uVar48] + 1;
        lVar40 = (long)(int)uVar14;
        uVar14 = uVar14 - 1;
        SA[lVar40 + -1] = uVar47 - 1;
        if (uVar13 != 1) {
          uVar50 = uVar12;
          uVar13 = uVar13 - 2;
          do {
            uVar12 = (uint)local_8e8[uVar13];
            if (uVar50 < local_8e8[uVar13]) {
              uVar29 = (ulong)uVar13;
              break;
            }
            bucket_B[uVar50 << 8 | uVar12] = bucket_B[uVar50 << 8 | uVar12] + 1;
            bVar54 = 0 < (int)uVar13;
            uVar50 = uVar12;
            uVar13 = uVar13 - 1;
          } while (bVar54);
        }
      }
    } while (-1 < (int)uVar29);
  }
  piVar16 = bucket_B + 0x100;
  uVar29 = 0;
  iVar35 = 0;
  piVar30 = bucket_B;
  do {
    iVar39 = local_860[uVar29];
    local_860[uVar29] = iVar26 + iVar35;
    iVar26 = iVar39 + iVar26 + bucket_B[(uint)((int)uVar29 << 8) | uVar29];
    if (uVar29 < 0xff) {
      lVar40 = 1;
      piVar45 = piVar16;
      do {
        iVar35 = iVar35 + piVar30[lVar40];
        piVar30[lVar40] = iVar35;
        iVar26 = iVar26 + *piVar45;
        piVar45 = piVar45 + 0x100;
        lVar18 = uVar29 + lVar40;
        lVar40 = lVar40 + 1;
      } while (lVar18 != 0xff);
    }
    uVar29 = uVar29 + 1;
    piVar16 = piVar16 + 0x101;
    piVar30 = piVar30 + 0x101;
  } while (uVar29 != 0x100);
  local_8e0._0_4_ = n - uVar14;
  uVar29 = (ulong)(uint)local_8e0;
  if ((uint)local_8e0 != 0 && (int)uVar14 <= n) {
    piVar16 = SA + ((uint)n - uVar29);
    if ((uint)local_8e0 != 1) {
      uVar44 = (ulong)((uint)local_8e0 - 2);
      iVar26 = ~uVar14 + n;
      do {
        uVar23 = *(ushort *)(local_8e8 + piVar16[uVar44]) << 8 |
                 *(ushort *)(local_8e8 + piVar16[uVar44]) >> 8;
        iVar35 = bucket_B[uVar23];
        bucket_B[uVar23] = iVar35 + -1;
        SA[(long)iVar35 + -1] = (int)uVar44;
        uVar44 = uVar44 - 1;
        iVar26 = iVar26 + -1;
      } while (0 < iVar26);
    }
    puVar1 = (uint *)(SA + uVar29);
    local_878 = (ulong)((uint)local_8e0 - 1);
    uVar23 = *(ushort *)(local_8e8 + piVar16[local_878]) << 8 |
             *(ushort *)(local_8e8 + piVar16[local_878]) >> 8;
    iVar26 = bucket_B[uVar23];
    bucket_B[uVar23] = iVar26 + -1;
    SA[(long)iVar26 + -1] = (uint)local_8e0 - 1;
    local_894 = n + (uint)local_8e0 * -2;
    local_848[1] = (ulong)(int)local_894;
    local_8c0 = (uint *)(local_8e8 + 2);
    local_888 = (uint *)(local_8e8 + n);
    local_8d0 = local_8e8 + 3;
    iVar26 = 0xfe;
    local_8e0 = uVar29;
    local_8d8 = uVar17;
    local_8b0 = (uint *)SA;
    local_868 = bucket_B;
    local_848[0] = uVar29;
    do {
      local_850 = (uint *)CONCAT44(local_850._4_4_,iVar26 << 8);
      uVar14 = 0xff;
      local_880 = CONCAT44(local_880._4_4_,iVar26);
      uVar44 = uVar29;
      do {
        puVar19 = local_8e8;
        local_890 = (uint *)CONCAT44(local_890._4_4_,uVar14);
        uVar14 = bucket_B[(int)(uVar14 | (uint)local_850)];
        uVar29 = (ulong)uVar14;
        if (1 < (int)((int)uVar44 - uVar14)) {
          uVar12 = ((uint *)SA)[(int)uVar14];
          local_8a8 = (uint *)SA + (int)uVar44;
          puVar52 = (uint *)SA + (int)uVar14 + (uVar12 == (uint)local_878);
          bVar54 = true;
          local_870 = CONCAT44(local_870._4_4_,uVar14);
          local_858 = (uint *)CONCAT44(local_858._4_4_,uVar12);
          puVar7 = local_8a8;
          local_8a0 = puVar1;
          uVar14 = local_894;
          if ((int)local_894 < 0x400) {
            uVar17 = (long)local_8a8 - (long)puVar52 >> 2;
            if ((long)local_848[1] < (long)uVar17) {
              iVar26 = 0x400;
              uVar12 = (uint)uVar17;
              if ((int)uVar12 < 0x100000) {
                if (uVar12 < 0x10000) {
                  if (uVar12 < 0x100) {
                    uVar50 = lg_table[uVar17 & 0xff];
                  }
                  else {
                    uVar50 = lg_table[uVar17 >> 8 & 0xff] + 8;
                  }
                }
                else if (uVar12 < 0x1000000) {
                  uVar50 = *(int *)((long)lg_table + (ulong)(uVar12 >> 0xe & 0x3fc)) + 0x10;
                }
                else {
                  uVar50 = lg_table[uVar12 >> 0x18] + 0x18;
                }
                if ((int)uVar50 < 0x10) {
                  if ((int)uVar50 < 8) {
                    iVar26 = sqq_table[(int)((ulong)((long)local_8a8 - (long)puVar52) >> 2)] >> 4;
                    goto LAB_0018b13c;
                  }
                  iVar26 = (sqq_table[(int)uVar12 >> (((byte)uVar50 & 0xfe) - 6 & 0x1f)] >>
                           (7U - (char)(uVar50 >> 1) & 0x1f)) + 1;
                }
                else {
                  iVar26 = sqq_table[(int)uVar12 >> (((byte)uVar50 & 0xfe) - 6 & 0x1f)] <<
                           ((char)(uVar50 >> 1) - 7U & 0x1f);
                  if (0x17 < (int)uVar50) {
                    iVar26 = iVar26 + (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                                  uVar17 & 0xffffffff) / (long)iVar26) + 1 >> 1;
                  }
                  iVar26 = iVar26 + (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                                uVar17 & 0xffffffff) / (long)iVar26) + 1 >> 1;
                }
                iVar26 = iVar26 - (uint)((int)uVar12 < iVar26 * iVar26);
              }
LAB_0018b13c:
              if ((int)local_894 < iVar26) {
                uVar14 = 0x400;
                if (iVar26 < 0x400) {
                  uVar14 = iVar26;
                }
                bVar54 = iVar26 == 0;
                puVar7 = local_8a8 + -(long)(int)uVar14;
                local_8a0 = local_8a8 + -(long)(int)uVar14;
              }
            }
          }
          local_8c4 = CONCAT31(local_8c4._1_3_,bVar54);
          uVar12 = 0;
          puVar8 = puVar52;
          if (0x1000 < (long)puVar7 - (long)puVar52) {
            uVar12 = 0;
            puVar9 = puVar52;
            do {
              puVar8 = puVar9 + 0x400;
              ss_mintrosort(puVar19,piVar16,(int *)puVar9,(int *)puVar8,(int)puVar9);
              iVar26 = (int)((ulong)((long)local_8a8 - (long)puVar8) >> 2);
              puVar20 = local_8a0;
              if ((int)uVar14 < iVar26) {
                puVar20 = puVar8;
              }
              if (iVar26 < (int)uVar14) {
                iVar26 = uVar14;
              }
              if ((uVar12 & 1) != 0) {
                iVar35 = 0x400;
                uVar50 = uVar12;
                do {
                  lVar40 = (long)iVar35;
                  ss_swapmerge(puVar19,piVar16,(int *)(puVar9 + -lVar40),(int *)puVar9,
                               (int *)(puVar9 + lVar40),(int *)puVar20,iVar26,
                               in_stack_fffffffffffff6c0);
                  iVar35 = iVar35 * 2;
                  uVar13 = uVar50 & 2;
                  puVar9 = puVar9 + -lVar40;
                  uVar50 = uVar50 >> 1;
                } while (uVar13 != 0);
              }
              uVar12 = uVar12 + 1;
              puVar9 = puVar8;
            } while (0x1000 < (long)puVar7 - (long)puVar8);
          }
          puVar9 = puVar8;
          ss_mintrosort(puVar19,piVar16,(int *)puVar8,(int *)puVar7,(int)puVar8);
          bucket_B = local_868;
          iVar26 = (int)puVar9;
          cVar4 = (char)local_8c4;
          if (uVar12 != 0) {
            iVar35 = 0x400;
            do {
              puVar20 = puVar8;
              if ((uVar12 & 1) != 0) {
                puVar20 = puVar8 + -(long)iVar35;
                puVar9 = puVar7;
                ss_swapmerge(local_8e8,piVar16,(int *)puVar20,(int *)puVar8,(int *)puVar7,
                             (int *)local_8a0,uVar14,in_stack_fffffffffffff6c0);
              }
              iVar26 = (int)puVar9;
              iVar35 = iVar35 * 2;
              bVar54 = 1 < uVar12;
              puVar8 = puVar20;
              uVar12 = uVar12 >> 1;
            } while (bVar54);
          }
          puVar8 = local_8a8;
          SA = (int *)local_8b0;
          if (cVar4 == '\0') {
            ss_mintrosort(local_8e8,piVar16,(int *)puVar7,(int *)local_8a8,iVar26);
            do {
              uVar14 = puVar8[-1];
              uVar17 = (ulong)((long)puVar7 - (long)puVar52) >> 2;
              puVar9 = puVar52;
              if ((int)uVar17 < 1) {
                bVar54 = false;
              }
              else {
                uVar29 = (ulong)((int)uVar14 >> 0x1f ^ uVar14);
                pbVar25 = (byte *)((long)local_8c0 + (long)piVar16[uVar29]);
                pbVar41 = (byte *)((long)piVar16[uVar29 + 1] + (long)local_8c0);
                uVar12 = 0xffffffff;
                do {
                  uVar44 = uVar17 >> 1 & 0x7fffffff;
                  uVar27 = (ulong)((int)puVar9[uVar44] >> 0x1f ^ puVar9[uVar44]);
                  pbVar24 = (byte *)((long)local_8c0 + (long)piVar16[uVar27]);
                  bVar54 = pbVar24 < (byte *)((long)piVar16[uVar27 + 1] + (long)local_8c0);
                  pbVar49 = pbVar25;
                  bVar53 = pbVar25 < pbVar41;
                  if ((bVar54) && (pbVar25 < pbVar41)) {
                    if (*pbVar24 == *pbVar25) {
                      pbVar5 = local_8d0 + piVar16[uVar27];
                      pbVar6 = local_8d0 + piVar16[uVar29];
                      do {
                        pbVar49 = pbVar6;
                        pbVar24 = pbVar5;
                        bVar54 = pbVar24 < (byte *)((long)piVar16[uVar27 + 1] + (long)local_8c0);
                        bVar53 = pbVar49 < pbVar41;
                        if ((!bVar54) || (pbVar41 <= pbVar49)) goto LAB_0018b42e;
                        pbVar5 = pbVar24 + 1;
                        pbVar6 = pbVar49 + 1;
                      } while (*pbVar24 == *pbVar49);
                    }
                    bVar54 = true;
                    bVar53 = true;
                  }
LAB_0018b42e:
                  if (bVar54) {
                    uVar50 = 1;
                    if (bVar53 != false) {
                      uVar50 = (uint)*pbVar24 - (uint)*pbVar49;
                    }
                  }
                  else {
                    uVar50 = -(uint)bVar53;
                  }
                  uVar13 = uVar50 >> 0x1f & ~(uint)uVar17;
                  puVar20 = puVar9 + uVar44 + 1;
                  if (-1 < (int)uVar50) {
                    puVar20 = puVar9;
                    uVar12 = uVar50;
                  }
                  puVar9 = puVar20;
                  uVar50 = (uint)uVar44 - uVar13;
                  uVar17 = (ulong)uVar50;
                } while (uVar50 != 0 && uVar13 <= (uint)uVar44);
                bVar54 = uVar12 == 0;
                bucket_B = local_868;
                SA = (int *)local_8b0;
              }
              if (puVar9 < puVar7) {
                if (bVar54) {
                  *puVar9 = ~*puVar9;
                }
                uVar17 = (ulong)((long)puVar7 - (long)puVar9) >> 2;
                if ((0 < (int)uVar17) &&
                   (uVar29 = (ulong)((long)puVar8 - (long)puVar7) >> 2, 0 < (int)uVar29)) {
                  puVar20 = puVar9;
                  puVar32 = puVar8;
LAB_0018b4ef:
                  uVar12 = (uint)uVar17;
                  uVar50 = (uint)uVar29;
                  if (uVar12 != uVar50) goto code_r0x0018b4f8;
                  iVar26 = uVar12 + 1;
                  lVar40 = 0;
                  do {
                    uVar2 = *(undefined4 *)((long)puVar20 + lVar40);
                    *(undefined4 *)((long)puVar20 + lVar40) = *(undefined4 *)((long)puVar7 + lVar40)
                    ;
                    *(undefined4 *)((long)puVar7 + lVar40) = uVar2;
                    lVar40 = lVar40 + 4;
                    iVar26 = iVar26 + -1;
                  } while (1 < iVar26);
                }
LAB_0018b5a2:
                if (puVar9 == puVar52) break;
                puVar8 = (uint *)((long)puVar8 - ((long)puVar7 - (long)puVar9));
                puVar7 = puVar9;
              }
              while (puVar8 = puVar8 + -1, (int)uVar14 < 0) {
                uVar14 = puVar8[-1];
              }
            } while (puVar7 != puVar8);
          }
          uVar29 = local_870 & 0xffffffff;
          uVar17 = local_8d8;
          iVar26 = (int)local_880;
          if ((int)local_858 == (uint)local_878) {
            uVar14 = puVar52[-1];
            if (puVar52 < local_8a8) {
              iVar35 = piVar16[(int)uVar14];
              pbVar25 = (byte *)((long)local_8c0 + (long)iVar35);
              do {
                lVar40 = (long)(int)*puVar52;
                if (-1 < lVar40) {
                  pbVar41 = (byte *)((long)local_8c0 + (long)piVar16[lVar40]);
                  pbVar49 = (byte *)((long)piVar16[lVar40 + 1] + (long)local_8c0);
                  bVar53 = pbVar41 < pbVar49;
                  pbVar24 = pbVar25;
                  bVar54 = pbVar25 < local_888;
                  if ((pbVar25 < local_888) && (pbVar41 < pbVar49)) {
                    if (*pbVar25 == *pbVar41) {
                      pbVar5 = local_8d0 + piVar16[lVar40];
                      pbVar6 = local_8d0 + iVar35;
                      do {
                        pbVar24 = pbVar6;
                        pbVar41 = pbVar5;
                        bVar53 = pbVar41 < pbVar49;
                        bVar54 = pbVar24 < local_888;
                        if ((!bVar54) || (pbVar49 <= pbVar41)) goto LAB_0018b6db;
                        pbVar5 = pbVar41 + 1;
                        pbVar6 = pbVar24 + 1;
                      } while (*pbVar24 == *pbVar41);
                    }
                    bVar53 = true;
                    bVar54 = true;
                  }
LAB_0018b6db:
                  if ((!bVar54) || ((bVar53 && (*pbVar24 <= *pbVar41)))) break;
                }
                puVar52[-1] = *puVar52;
                puVar52 = puVar52 + 1;
              } while (puVar52 < local_8a8);
            }
            puVar52[-1] = uVar14;
            uVar29 = local_870 & 0xffffffff;
          }
        }
        iVar35 = (int)uVar17;
        uVar14 = (int)local_890 - 1;
        uVar44 = uVar29;
      } while (iVar26 < (int)uVar14);
      iVar26 = iVar26 + -1;
      uVar44 = local_878;
    } while (0 < (int)uVar29);
    do {
      uVar14 = (uint)uVar44;
      if (-1 < (int)((uint *)SA)[uVar44 & 0xffffffff]) {
        uVar12 = (int)uVar14 >> 0x1f & uVar14;
        uVar27 = uVar44 & 0xffffffff;
        uVar29 = uVar44 & 0xffffffff;
        do {
          uVar44 = uVar29;
          uVar48 = (uint)uVar27;
          puVar1[(int)((uint *)SA)[uVar44]] = uVar48;
          uVar50 = uVar12;
          uVar13 = uVar12 - 1;
          if ((int)uVar48 < 1) break;
          uVar13 = uVar48 - 1;
          uVar27 = (ulong)uVar13;
          uVar50 = uVar48;
          uVar29 = uVar44 - 1;
        } while (-1 < (int)((uint *)SA)[uVar44 - 1 & 0xffffffff]);
        ((uint *)SA)[uVar44] = uVar13 - uVar14;
        uVar14 = uVar13;
        if ((int)uVar50 < 2) break;
      }
      lVar40 = (long)(int)uVar14 + 1;
      uVar44 = (ulong)(uVar14 - 1);
      do {
        uVar12 = ((uint *)SA)[lVar40 + -1];
        ((uint *)SA)[lVar40 + -1] = (uint)~(long)(int)uVar12;
        puVar1[~(long)(int)uVar12] = uVar14;
        lVar18 = lVar40 + -2;
        lVar40 = lVar40 + -1;
        uVar44 = (ulong)((int)uVar44 - 1);
      } while ((long)(int)((uint *)SA)[lVar18] < 0);
      puVar1[(int)((uint *)SA)[lVar18]] = uVar14;
    } while (1 < lVar40);
    local_924 = (uint)local_8e0;
    if (local_924 < 0x10000) {
      if (local_924 < 0x100) {
        iVar26 = lg_table[local_848[0]];
      }
      else {
        iVar26 = lg_table[local_8e0 >> 8 & 0xffffff] + 8;
      }
    }
    else if (local_924 < 0x1000000) {
      iVar26 = lg_table[local_924 >> 0x10] + 0x10;
    }
    else {
      iVar26 = lg_table[local_924 >> 0x18] + 0x18;
    }
    local_894 = -local_924;
    uVar14 = *SA;
    if (uVar14 != local_894 && SBORROW4(uVar14,local_894) == (int)(uVar14 + local_924) < 0) {
      puVar52 = puVar1 + 1;
      iVar26 = (iVar26 * 2) / 3;
      local_850 = (uint *)SA + 1;
      local_8a8 = (uint *)-(long)SA;
      local_870 = 4 - (long)SA;
      do {
        local_880 = (long)puVar52 - (long)puVar1;
        lVar40 = (long)(int)(local_880 >> 2);
        local_8a0 = (uint *)-lVar40;
        uVar29 = 0;
        local_8c4 = 0;
        local_888 = (uint *)SA;
        local_858 = puVar52;
        do {
          lVar18 = (long)(int)*local_888;
          uVar14 = (uint)uVar29;
          if (lVar18 < 0) {
            local_890 = local_888 + -lVar18;
            uVar29 = (ulong)(uVar14 + *local_888);
          }
          else {
            if (uVar14 != 0) {
              local_888[(int)uVar14] = uVar14;
            }
            local_890 = local_850 + (int)puVar1[lVar18];
            uVar29 = (long)local_890 - (long)local_888;
            if ((long)uVar29 < 5) {
              uVar29 = (ulong)-(uint)(uVar29 == 4);
            }
            else {
              uVar14 = (uint)(uVar29 >> 2);
              if (uVar14 < 0x10000) {
                if (uVar14 < 0x100) {
                  uVar14 = lg_table[uVar29 >> 2 & 0xff];
                }
                else {
                  uVar14 = lg_table[(uint)(uVar29 >> 10) & 0xffffff] + 8;
                }
              }
              else if (uVar14 < 0x1000000) {
                uVar14 = lg_table[uVar29 >> 0x12 & 0xffff] + 0x10;
              }
              else {
                uVar14 = lg_table[uVar29 >> 0x1a & 0xff] + 0x18;
              }
              uVar17 = 0xffffffff;
              iVar35 = 0;
              uVar29 = 0;
              puVar7 = local_890;
              puVar8 = local_888;
LAB_0018b9df:
              iVar39 = (int)uVar29;
              uVar12 = (uint)uVar17;
              if ((int)uVar14 < 0) {
LAB_0018c4cf:
                if (uVar14 == 0xfffffffe) {
                  lVar18 = (long)iVar39;
                  local_8f0 = (&local_850)[lVar18 * 4];
                  local_8b8 = (uint *)local_848[lVar18 * 4];
                  if ((int)local_848[lVar18 * 4 + 1] == 0) {
                    uVar14 = (int)((ulong)((long)local_8b8 - (long)SA) >> 2) - 1;
                    puVar9 = local_8f0 + -1;
                    iVar15 = (int)((ulong)((long)puVar52 - (long)puVar1) >> 2);
                    if (puVar8 <= puVar9) {
                      do {
                        uVar12 = *puVar8 - iVar15;
                        if ((-1 < (int)uVar12) && (puVar1[uVar12] == uVar14)) {
                          puVar9[1] = uVar12;
                          puVar9 = puVar9 + 1;
                          puVar1[uVar12] = (uint)((ulong)((long)puVar9 - (long)SA) >> 2);
                        }
                        puVar8 = puVar8 + 1;
                      } while (puVar8 <= puVar9);
                    }
                    puVar52 = local_8b8;
                    while (puVar9 + 1 < puVar52) {
                      puVar7 = puVar7 + -1;
                      uVar12 = *puVar7 - iVar15;
                      if ((-1 < (int)uVar12) && (puVar1[uVar12] == uVar14)) {
                        puVar52[-1] = uVar12;
                        puVar52 = puVar52 + -1;
                        puVar1[uVar12] = (uint)((ulong)((long)puVar52 - (long)SA) >> 2);
                      }
                    }
                  }
                  else {
                    if (-1 < (int)uVar12) {
                      auStack_820[uVar17 * 8] = 0xffffffff;
                    }
                    uVar14 = (int)((ulong)((long)local_8b8 - (long)SA) >> 2) - 1;
                    puVar9 = local_8f0 + -1;
                    uVar12 = 0xffffffff;
                    iVar15 = (int)((ulong)((long)puVar52 - (long)puVar1) >> 2);
                    if (puVar8 <= puVar9) {
                      uVar12 = 0xffffffff;
                      uVar50 = 0xffffffff;
                      puVar52 = puVar8;
                      do {
                        uVar13 = *puVar52;
                        uVar48 = uVar13 - iVar15;
                        if ((-1 < (int)uVar48) && (puVar1[uVar48] == uVar14)) {
                          puVar9[1] = uVar48;
                          puVar9 = puVar9 + 1;
                          uVar13 = puVar1[(int)uVar13];
                          uVar47 = (uint)((ulong)((long)puVar9 - (long)SA) >> 2);
                          if (uVar50 == uVar13) {
                            uVar47 = uVar12;
                          }
                          uVar12 = uVar47;
                          puVar1[uVar48] = uVar12;
                          uVar50 = uVar13;
                        }
                        puVar52 = puVar52 + 1;
                      } while (puVar52 <= puVar9);
                    }
                    if (puVar8 <= puVar9) {
                      uVar17 = (long)local_8a8 + (long)puVar9;
                      puVar52 = puVar9;
                      uVar50 = 0xffffffff;
                      do {
                        uVar13 = puVar1[(int)*puVar52];
                        uVar48 = (uint)(uVar17 >> 2);
                        if (uVar50 == uVar13) {
                          uVar48 = uVar12;
                        }
                        uVar12 = uVar48;
                        if (uVar12 != uVar13) {
                          puVar1[(int)*puVar52] = uVar12;
                        }
                        puVar52 = puVar52 + -1;
                        uVar17 = uVar17 - 4;
                        uVar50 = uVar13;
                      } while (puVar8 <= puVar52);
                    }
                    if (puVar9 + 1 < local_8b8) {
                      uVar50 = 0xffffffff;
                      puVar52 = local_8b8;
                      do {
                        puVar7 = puVar7 + -1;
                        uVar13 = *puVar7;
                        uVar48 = uVar13 - iVar15;
                        if ((-1 < (int)uVar48) && (puVar1[uVar48] == uVar14)) {
                          puVar52[-1] = uVar48;
                          puVar52 = puVar52 + -1;
                          uVar13 = puVar1[(int)uVar13];
                          uVar47 = (uint)((ulong)((long)puVar52 - (long)SA) >> 2);
                          if (uVar50 == uVar13) {
                            uVar47 = uVar12;
                          }
                          uVar12 = uVar47;
                          puVar1[uVar48] = uVar12;
                          uVar50 = uVar13;
                        }
                      } while (puVar9 + 1 < puVar52);
                    }
                  }
                  if (iVar39 < 1) {
                    __assert_fail("0 <= ssize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xb990,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  if (iVar39 == 1) goto LAB_0018d44c;
                  uVar29 = (ulong)(iVar39 - 2);
                  puVar52 = (uint *)local_848[uVar29 * 4 + 2];
                  puVar7 = *(uint **)(auStack_820 + uVar29 * 8 + -2);
                  uVar17 = (ulong)auStack_820[uVar29 * 8 + 1];
                  puVar8 = (uint *)local_848[uVar29 * 4 + 3];
                  uVar14 = auStack_820[uVar29 * 8];
                  goto LAB_0018b9df;
                }
                if (uVar14 == 0xffffffff) {
                  puVar9 = puVar52 + (long)local_8a0;
                  tr_partition((int *)puVar9,(int *)puVar8,(int *)puVar8,(int *)puVar7,
                               (int **)&local_8f0,(int **)&local_8b8,
                               (int)((ulong)((long)puVar7 - (long)SA) >> 2) + -1);
                  if ((local_8f0 < puVar7) && (puVar8 < local_8f0)) {
                    puVar20 = puVar8;
                    do {
                      puVar1[(int)*puVar20] = (int)((ulong)((long)local_8f0 - (long)SA) >> 2) - 1;
                      puVar20 = puVar20 + 1;
                    } while (puVar20 < local_8f0);
                  }
                  if ((local_8b8 < puVar7) && (local_8f0 < local_8b8)) {
                    puVar20 = local_8f0;
                    do {
                      puVar1[(int)*puVar20] = (int)((ulong)((long)local_8b8 - (long)SA) >> 2) - 1;
                      puVar20 = puVar20 + 1;
                    } while (puVar20 < local_8b8);
                  }
                  if (4 < (long)local_8b8 - (long)local_8f0) {
                    if (0x3f < iVar39) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb970,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    lVar18 = (long)iVar39;
                    local_848[lVar18 * 4 + 2] = 0;
                    local_848[lVar18 * 4 + 3] = (ulong)local_8f0;
                    *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8b8;
                    (auStack_820 + lVar18 * 8)[0] = 0;
                    (auStack_820 + lVar18 * 8)[1] = 0;
                    if (iVar39 == 0x3f) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb971,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    alStack_818[lVar18 * 4] = (long)puVar9;
                    alStack_818[lVar18 * 4 + 1] = (long)puVar8;
                    *(uint **)(auStack_800 + lVar18 * 8 + -2) = puVar7;
                    auStack_800[lVar18 * 8] = 0xfffffffe;
                    auStack_800[lVar18 * 8 + 1] = uVar12;
                    uVar17 = uVar29;
                    uVar29 = (ulong)(iVar39 + 2);
                  }
                  uVar31 = (long)local_8f0 - (long)puVar8;
                  uVar27 = (long)uVar31 >> 2;
                  uVar34 = (long)puVar7 - (long)local_8b8;
                  uVar44 = (long)uVar34 >> 2;
                  iVar39 = (int)uVar29;
                  if ((long)uVar44 < (long)uVar27) {
                    if (1 < (long)uVar44) {
                      if (0x3f < iVar39) {
                        __assert_fail("ssize < STACK_SIZE",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xb97f,
                                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                     );
                      }
                      lVar18 = (long)iVar39;
                      local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                      local_848[lVar18 * 4 + 3] = (ulong)puVar8;
                      *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8f0;
                      uVar14 = (uint)(uVar31 >> 2);
                      if (uVar14 < 0x10000) {
                        if (uVar14 < 0x100) {
                          uVar14 = lg_table[uVar31 >> 2 & 0xff];
                        }
                        else {
                          uVar14 = lg_table[(uint)(uVar31 >> 10) & 0xffffff] + 8;
                        }
                      }
                      else if (uVar14 < 0x1000000) {
                        uVar14 = lg_table[uVar31 >> 0x12 & 0xffff] + 0x10;
                      }
                      else {
                        uVar14 = lg_table[uVar31 >> 0x1a & 0xff] + 0x18;
                      }
                      auStack_820[lVar18 * 8] = uVar14;
                      uVar29 = (ulong)(iVar39 + 1);
                      auStack_820[lVar18 * 8 + 1] = (uint)uVar17;
                      uVar44 = uVar34 >> 2;
                      uVar14 = (uint)uVar44;
                      if (uVar14 < 0x10000) {
                        if (uVar14 < 0x100) {
LAB_0018ce89:
                          uVar14 = lg_table[uVar44 & 0xff];
                          puVar8 = local_8b8;
                        }
                        else {
                          iVar39 = lg_table[(uint)(uVar34 >> 10) & 0xffffff];
LAB_0018cf46:
                          uVar14 = iVar39 + 8;
                          puVar8 = local_8b8;
                        }
                      }
                      else if (uVar14 < 0x1000000) {
                        iVar39 = lg_table[uVar34 >> 0x12 & 0xffff];
LAB_0018cebc:
                        uVar14 = iVar39 + 0x10;
                        puVar8 = local_8b8;
                      }
                      else {
                        uVar44 = uVar34 >> 0x1a & 0xff;
LAB_0018d155:
                        uVar14 = lg_table[uVar44] + 0x18;
                        puVar8 = local_8b8;
                      }
                      goto LAB_0018b9df;
                    }
                    if (1 < (long)uVar27) {
                      uVar14 = (uint)uVar27;
                      if (uVar14 < 0x10000) {
                        if (uVar14 < 0x100) {
                          uVar14 = lg_table[uVar27 & 0xff];
                          puVar7 = local_8f0;
                        }
                        else {
                          uVar14 = lg_table[uVar27 >> 8 & 0xff] + 8;
                          puVar7 = local_8f0;
                        }
                      }
                      else if (uVar14 < 0x1000000) {
                        uVar14 = *(int *)((long)lg_table + (ulong)(uVar14 >> 0xe & 0x3fc)) + 0x10;
                        puVar7 = local_8f0;
                      }
                      else {
                        uVar14 = lg_table[uVar14 >> 0x18] + 0x18;
                        puVar7 = local_8f0;
                      }
                      goto LAB_0018b9df;
                    }
                    if (iVar39 < 0) {
                      __assert_fail("0 <= ssize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb984,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                  }
                  else {
                    if (1 < (long)uVar27) {
                      if (0x3f < iVar39) {
                        __assert_fail("ssize < STACK_SIZE",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xb976,
                                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                     );
                      }
                      lVar18 = (long)iVar39;
                      local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                      local_848[lVar18 * 4 + 3] = (ulong)local_8b8;
                      *(uint **)(auStack_820 + lVar18 * 8 + -2) = puVar7;
                      uVar14 = (uint)(uVar34 >> 2);
                      if (uVar14 < 0x10000) {
                        if (uVar14 < 0x100) {
                          uVar14 = lg_table[uVar34 >> 2 & 0xff];
                        }
                        else {
                          uVar14 = lg_table[(uint)(uVar34 >> 10) & 0xffffff] + 8;
                        }
                      }
                      else if (uVar14 < 0x1000000) {
                        uVar14 = lg_table[uVar34 >> 0x12 & 0xffff] + 0x10;
                      }
                      else {
                        uVar14 = lg_table[uVar34 >> 0x1a & 0xff] + 0x18;
                      }
                      auStack_820[lVar18 * 8] = uVar14;
                      uVar29 = (ulong)(iVar39 + 1);
                      auStack_820[lVar18 * 8 + 1] = (uint)uVar17;
                      uVar14 = (uint)(uVar31 >> 2);
                      if (uVar14 < 0x10000) {
                        if (uVar14 < 0x100) {
                          uVar14 = lg_table[uVar31 >> 2 & 0xff];
                          puVar7 = local_8f0;
                        }
                        else {
                          uVar14 = lg_table[(uint)(uVar31 >> 10) & 0xffffff] + 8;
                          puVar7 = local_8f0;
                        }
                      }
                      else if (uVar14 < 0x1000000) {
                        uVar14 = lg_table[uVar31 >> 0x12 & 0xffff] + 0x10;
                        puVar7 = local_8f0;
                      }
                      else {
                        uVar14 = lg_table[uVar31 >> 0x1a & 0xff] + 0x18;
                        puVar7 = local_8f0;
                      }
                      goto LAB_0018b9df;
                    }
                    if (1 < (long)uVar44) {
                      uVar14 = (uint)uVar44;
                      if (0xffff < uVar14) {
                        if (0xffffff < uVar14) {
                          uVar44 = (ulong)(uVar14 >> 0x18);
                          goto LAB_0018d155;
                        }
                        iVar39 = *(int *)((long)lg_table + (ulong)(uVar14 >> 0xe & 0x3fc));
                        goto LAB_0018cebc;
                      }
                      if (0xff < uVar14) {
                        iVar39 = lg_table[uVar44 >> 8 & 0xff];
                        goto LAB_0018cf46;
                      }
                      goto LAB_0018ce89;
                    }
                    if (iVar39 < 0) {
                      __assert_fail("0 <= ssize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb97b,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                  }
                  if (iVar39 == 0) goto LAB_0018d44c;
                  uVar29 = (ulong)(iVar39 - 1);
                  puVar52 = (uint *)local_848[uVar29 * 4 + 2];
                  uVar17 = (ulong)auStack_820[uVar29 * 8 + 1];
                  puVar7 = *(uint **)(auStack_820 + uVar29 * 8 + -2);
                  puVar8 = (uint *)local_848[uVar29 * 4 + 3];
                  uVar14 = auStack_820[uVar29 * 8];
                  goto LAB_0018b9df;
                }
                if (-1 < (int)*puVar8) {
                  uVar44 = (long)local_8a8 + (long)puVar8;
                  puVar9 = puVar8;
                  do {
                    puVar8 = puVar9 + 1;
                    puVar1[(int)*puVar9] = (uint)(uVar44 >> 2);
                    local_8f0 = puVar8;
                    if (puVar7 <= puVar8) break;
                    uVar44 = uVar44 + 4;
                    puVar9 = puVar8;
                  } while (-1 < (int)*puVar8);
                }
                if (puVar8 < puVar7) {
                  uVar44 = 0;
                  do {
                    uVar27 = uVar44;
                    *(uint *)((long)puVar8 + uVar27) = ~*(uint *)((long)puVar8 + uVar27);
                    lVar18 = (long)*(int *)((long)puVar8 + uVar27 + 4);
                    uVar44 = uVar27 + 4;
                  } while (lVar18 < 0);
                  uVar14 = 0xffffffff;
                  if (puVar1[lVar18] != puVar52[lVar18]) {
                    uVar14 = (int)(uVar44 >> 2) + 1;
                    if (uVar14 < 0x10000) {
                      if (uVar14 < 0x100) {
                        uVar14 = lg_table[uVar14];
                      }
                      else {
                        uVar14 = lg_table[uVar14 >> 8] + 8;
                      }
                    }
                    else if (uVar14 < 0x1000000) {
                      uVar14 = lg_table[uVar14 >> 0x10] + 0x10;
                    }
                    else {
                      uVar14 = lg_table[uVar14 >> 0x18] + 0x18;
                    }
                  }
                  local_8f0 = (uint *)((long)puVar8 + uVar27 + 8);
                  if ((local_8f0 < puVar7) && (local_8b8 = puVar8, puVar8 < local_8f0)) {
                    do {
                      puVar1[(int)*local_8b8] = (int)((long)puVar8 + uVar44 + local_870 >> 2) - 1;
                      local_8b8 = local_8b8 + 1;
                    } while (local_8b8 < local_8f0);
                  }
                  iVar15 = (int)(uVar27 + 8 >> 2);
                  if ((int)local_924 < iVar15) {
                    if (iVar26 == 0) {
                      if (-1 < (int)uVar12) {
                        auStack_820[uVar17 * 8] = 0xffffffff;
                      }
                      iVar35 = iVar35 + iVar15;
                      lVar18 = -uVar44 - (long)puVar8;
                      puVar8 = local_8f0;
                      uVar14 = 0xfffffffd;
                      if ((long)puVar7 + lVar18 + -4 < 5) {
                        if (iVar39 < 0) {
                          __assert_fail("0 <= ssize",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0xb9af,
                                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                       );
                        }
                        goto joined_r0x0018caad;
                      }
                      goto LAB_0018b9df;
                    }
                    local_924 = local_924 + (uint)local_8e0;
                    iVar26 = iVar26 + -1;
                  }
                  local_924 = local_924 - iVar15;
                  lVar18 = (long)puVar7 + (-uVar44 - (long)puVar8) + -4;
                  if (lVar18 < (long)(uVar27 + 8)) {
                    if (lVar18 < 5) {
                      puVar52 = puVar52 + lVar40;
                      puVar7 = local_8f0;
                    }
                    else {
                      if (0x3f < iVar39) {
                        __assert_fail("ssize < STACK_SIZE",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xb9a4,
                                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                     );
                      }
                      lVar18 = (long)iVar39;
                      local_848[lVar18 * 4 + 2] = (ulong)(puVar52 + lVar40);
                      local_848[lVar18 * 4 + 3] = (ulong)puVar8;
                      *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8f0;
                      auStack_820[lVar18 * 8] = uVar14;
                      uVar29 = (ulong)(iVar39 + 1);
                      auStack_820[lVar18 * 8 + 1] = uVar12;
                      puVar8 = local_8f0;
                      uVar14 = 0xfffffffd;
                    }
                  }
                  else {
                    if (0x3f < iVar39) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb9a0,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    lVar18 = (long)iVar39;
                    local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                    local_848[lVar18 * 4 + 3] = (ulong)local_8f0;
                    *(uint **)(auStack_820 + lVar18 * 8 + -2) = puVar7;
                    auStack_820[lVar18 * 8] = 0xfffffffd;
                    uVar29 = (ulong)(iVar39 + 1);
                    auStack_820[lVar18 * 8 + 1] = uVar12;
                    puVar52 = puVar52 + lVar40;
                    puVar7 = local_8f0;
                  }
                  goto LAB_0018b9df;
                }
                if (iVar39 < 0) {
                  __assert_fail("0 <= ssize",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb9b3,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
              }
              else {
                local_8c0 = local_8b8;
                uVar44 = (long)puVar7 - (long)puVar8;
                puVar19 = (uchar *)((long)uVar44 >> 2);
                puVar9 = puVar8;
                if ((long)puVar19 < 9) {
                  while (puVar20 = puVar9 + 1, puVar20 < puVar7) {
                    uVar14 = puVar9[1];
                    uVar50 = puVar52[(int)uVar14];
                    uVar13 = puVar52[(int)*puVar9];
                    if ((int)uVar50 < (int)uVar13) {
                      do {
                        do {
                          puVar32 = puVar9;
                          puVar32[1] = *puVar32;
                          puVar9 = puVar32 + -1;
                          if (puVar9 < puVar8) goto LAB_0018ba75;
                        } while ((long)(int)*puVar9 < 0);
                        uVar50 = puVar52[(int)uVar14];
                        uVar13 = puVar52[(int)*puVar9];
                      } while ((int)uVar50 < (int)uVar13);
LAB_0018ba75:
                      puVar9 = puVar32 + -1;
                    }
                    if (uVar50 == uVar13) {
                      *puVar9 = ~*puVar9;
                    }
                    puVar9[1] = uVar14;
                    puVar9 = puVar20;
                  }
LAB_0018c4c7:
                  uVar14 = 0xfffffffd;
                  goto LAB_0018c4cf;
                }
                puVar9 = puVar7 + -1;
                local_8d0 = puVar19;
                if (uVar14 == 0) {
                  uVar50 = (uint)puVar19;
                  uVar14 = uVar50;
                  if (((ulong)puVar19 & 1) == 0) {
                    uVar14 = uVar50 - 1;
                    iVar15 = (int)((uVar50 - ((int)uVar14 >> 0x1f)) + -1) >> 1;
                    uVar50 = puVar8[(int)uVar14];
                    if ((int)puVar52[(int)puVar8[iVar15]] < (int)puVar52[(int)uVar50]) {
                      puVar8[(int)uVar14] = puVar8[iVar15];
                      puVar8[iVar15] = uVar50;
                    }
                  }
                  if (1 < (int)uVar14) {
                    uVar44 = (ulong)(uVar14 >> 1);
                    do {
                      uVar31 = uVar44 - 1;
                      uVar50 = puVar8[uVar44 - 1];
                      uVar27 = uVar44 * 2 - 1;
                      if ((long)uVar27 < (long)(ulong)uVar14) {
                        uVar48 = puVar52[(int)uVar50];
                        uVar34 = uVar44 * 2 - 2;
                        uVar21 = uVar31 & 0xffffffff;
                        do {
                          uVar51 = (uint)uVar27;
                          uVar47 = puVar52[(int)puVar8[(int)uVar51]];
                          uVar28 = puVar52[(int)puVar8[(long)(int)uVar34 + 2]];
                          uVar3 = uVar28;
                          if ((int)uVar28 < (int)uVar47) {
                            uVar3 = uVar47;
                          }
                          uVar13 = (uint)uVar21;
                          if ((int)uVar3 <= (int)uVar48) break;
                          if ((int)uVar47 < (int)uVar28) {
                            uVar51 = (int)uVar34 + 2;
                          }
                          uVar21 = (ulong)uVar51;
                          puVar8[(int)uVar13] = puVar8[(int)uVar51];
                          uVar47 = uVar51 * 2 + 1;
                          uVar27 = (ulong)uVar47;
                          uVar34 = (ulong)(uVar51 * 2);
                          uVar13 = uVar51;
                        } while ((int)uVar47 < (int)uVar14);
                      }
                      else {
                        uVar13 = (uint)uVar31;
                      }
                      puVar8[(int)uVar13] = uVar50;
                      bVar54 = 1 < (long)uVar44;
                      uVar44 = uVar31;
                    } while (bVar54);
                  }
                  if (((ulong)puVar19 & 1) == 0) {
                    uVar50 = *puVar8;
                    *puVar8 = puVar8[(int)uVar14];
                    puVar8[(int)uVar14] = uVar50;
                    uVar50 = *puVar8;
                    if ((int)uVar14 < 2) {
                      lVar18 = 0;
                    }
                    else {
                      uVar13 = puVar52[(int)uVar50];
                      iVar15 = 0;
                      iVar36 = 1;
                      iVar38 = 0;
                      do {
                        uVar48 = puVar52[(int)puVar8[iVar36]];
                        uVar47 = puVar52[(int)puVar8[(long)iVar15 + 2]];
                        uVar28 = uVar47;
                        if ((int)uVar47 < (int)uVar48) {
                          uVar28 = uVar48;
                        }
                        iVar43 = iVar38;
                        if ((int)uVar28 <= (int)uVar13) break;
                        iVar43 = iVar36;
                        if ((int)uVar48 < (int)uVar47) {
                          iVar43 = iVar15 + 2;
                        }
                        puVar8[iVar38] = puVar8[iVar43];
                        iVar36 = iVar43 * 2 + 1;
                        iVar15 = iVar43 * 2;
                        iVar38 = iVar43;
                      } while (iVar36 < (int)uVar14);
                      lVar18 = (long)iVar43;
                    }
                    puVar8[lVar18] = uVar50;
                  }
                  if (1 < (int)uVar14) {
                    uVar44 = (ulong)uVar14;
                    do {
                      uVar27 = uVar44 - 1;
                      uVar14 = *puVar8;
                      uVar50 = puVar8[uVar44 - 1];
                      *puVar8 = uVar50;
                      if (uVar44 == 2) {
                        lVar18 = 0;
                      }
                      else {
                        uVar13 = puVar52[(int)uVar50];
                        iVar15 = 0;
                        iVar36 = 1;
                        iVar38 = 0;
                        do {
                          uVar48 = puVar52[(int)puVar8[iVar36]];
                          uVar47 = puVar52[(int)puVar8[(long)iVar15 + 2]];
                          uVar28 = uVar47;
                          if ((int)uVar47 < (int)uVar48) {
                            uVar28 = uVar48;
                          }
                          iVar43 = iVar38;
                          if ((int)uVar28 <= (int)uVar13) break;
                          iVar43 = iVar36;
                          if ((int)uVar48 < (int)uVar47) {
                            iVar43 = iVar15 + 2;
                          }
                          puVar8[iVar38] = puVar8[iVar43];
                          iVar36 = iVar43 * 2 + 1;
                          iVar15 = iVar43 * 2;
                          iVar38 = iVar43;
                        } while ((long)iVar36 < (long)uVar27);
                        lVar18 = (long)iVar43;
                      }
                      puVar8[lVar18] = uVar50;
                      puVar8[uVar27] = uVar14;
                      bVar54 = 2 < (long)uVar44;
                      uVar44 = uVar27;
                    } while (bVar54);
                  }
                  uVar14 = 0xfffffffd;
                  local_8f0 = puVar9;
                  bucket_B = local_868;
                  SA = (int *)local_8b0;
                  if (puVar8 < puVar9) {
                    do {
                      local_8f0 = puVar9 + -1;
                      if (puVar8 <= local_8f0) {
                        uVar50 = puVar52[(int)*puVar9];
                        do {
                          if (puVar52[(int)*local_8f0] != uVar50) break;
                          *local_8f0 = ~*local_8f0;
                          local_8f0 = local_8f0 + -1;
                        } while (puVar8 <= local_8f0);
                      }
                      puVar9 = local_8f0;
                      local_8b8 = local_8f0;
                    } while (puVar8 < local_8f0);
                    goto LAB_0018c4cf;
                  }
                  goto LAB_0018c4c7;
                }
                uVar50 = (uint)(uVar44 >> 2);
                puVar20 = puVar8 + ((int)(((uint)(uVar44 >> 0x21) & 1) + uVar50) >> 1);
                if ((int)uVar50 < 0x201) {
                  if ((int)uVar50 < 0x21) {
                    local_8f0 = puVar20;
                    if ((int)puVar52[(int)*puVar20] < (int)puVar52[(int)*puVar8]) {
                      local_8f0 = puVar8;
                    }
                    if ((int)puVar52[(int)*puVar9] < (int)puVar52[(int)*local_8f0]) {
                      if ((int)puVar52[(int)*puVar8] <= (int)puVar52[(int)*puVar20]) {
                        puVar20 = puVar8;
                      }
                      local_8f0 = puVar9;
                      if ((int)puVar52[(int)*puVar9] < (int)puVar52[(int)*puVar20]) {
                        local_8f0 = puVar20;
                      }
                    }
                  }
                  else {
                    uVar50 = (uint)(uVar44 >> 4);
                    uVar44 = (ulong)(uVar50 << 2);
                    lVar18 = -(ulong)(uVar50 & 0x3fffffff);
                    puVar33 = (uint *)((long)puVar9 - uVar44);
                    puVar46 = puVar20;
                    puVar32 = (uint *)((long)puVar8 + uVar44);
                    if ((int)puVar52[(int)*puVar20] < (int)puVar52[*(int *)((long)puVar8 + uVar44)])
                    {
                      puVar46 = (uint *)((long)puVar8 + uVar44);
                      puVar32 = puVar20;
                    }
                    puVar20 = puVar9;
                    if ((int)puVar52[(int)*puVar9] < (int)puVar52[(int)*puVar33]) {
                      puVar20 = puVar33;
                      lVar18 = 0;
                      puVar33 = puVar9;
                    }
                    puVar42 = puVar20;
                    if ((int)puVar52[(int)puVar9[lVar18]] < (int)puVar52[(int)*puVar32]) {
                      puVar42 = puVar46;
                      puVar46 = puVar20;
                      puVar33 = puVar32;
                    }
                    puVar9 = puVar46;
                    local_8f0 = puVar8;
                    if ((int)puVar52[(int)*puVar46] < (int)puVar52[(int)*puVar8]) {
                      puVar9 = puVar8;
                      local_8f0 = puVar46;
                    }
                    if ((int)puVar52[(int)*local_8f0] <= (int)puVar52[(int)*puVar33]) {
                      local_8f0 = puVar33;
                      puVar42 = puVar9;
                    }
                    if ((int)puVar52[(int)*puVar42] <= (int)puVar52[(int)*local_8f0]) {
                      local_8f0 = puVar42;
                    }
                  }
                }
                else {
                  uVar44 = uVar44 >> 5 & 0x1fffffff;
                  puVar32 = puVar8 + uVar44;
                  puVar33 = puVar32;
                  if ((int)puVar52[(int)*puVar32] < (int)puVar52[(int)*puVar8]) {
                    puVar33 = puVar8;
                  }
                  if ((int)puVar52[*(int *)((long)puVar8 + (ulong)(uVar50 & 0xfffffff8))] <
                      (int)puVar52[(int)*puVar33]) {
                    if ((int)puVar52[(int)*puVar8] <= (int)puVar52[(int)*puVar32]) {
                      puVar32 = puVar8;
                    }
                    puVar33 = puVar32;
                    if ((int)puVar52[(int)*puVar32] <=
                        (int)puVar52[*(int *)((long)puVar8 + (ulong)(uVar50 & 0xfffffff8))]) {
                      puVar33 = (uint *)((ulong)(uVar50 & 0xfffffff8) + (long)puVar8);
                    }
                  }
                  lVar37 = -uVar44;
                  iVar15 = (int)uVar44;
                  uVar27 = (ulong)(uint)(iVar15 * 4);
                  puVar46 = (uint *)((long)puVar20 - uVar27);
                  puVar32 = puVar20;
                  lVar18 = 0;
                  if ((int)puVar52[(int)*puVar20] < (int)puVar52[(int)*puVar46]) {
                    puVar32 = puVar46;
                    lVar18 = lVar37;
                  }
                  if ((int)puVar52[*(int *)((long)puVar20 + uVar27)] <
                      (int)puVar52[(int)puVar20[lVar18]]) {
                    if ((int)puVar52[(int)*puVar20] < (int)puVar52[(int)*puVar46]) {
                      puVar46 = puVar20;
                    }
                    puVar32 = puVar46;
                    if ((int)puVar52[(int)*puVar46] <=
                        (int)puVar52[*(int *)((long)puVar20 + uVar27)]) {
                      puVar32 = (uint *)(uVar27 + (long)puVar20);
                    }
                  }
                  puVar42 = (uint *)((long)puVar9 - (ulong)(uint)(iVar15 << 3));
                  puVar20 = puVar9 + -uVar44;
                  puVar46 = puVar20;
                  if ((int)puVar52[(int)*puVar20] < (int)puVar52[(int)*puVar42]) {
                    puVar46 = puVar42;
                    lVar37 = -(ulong)(uint)(iVar15 * 2);
                  }
                  if ((int)puVar52[(int)*puVar9] < (int)puVar52[(int)puVar9[lVar37]]) {
                    if ((int)puVar52[(int)*puVar20] < (int)puVar52[(int)*puVar42]) {
                      puVar42 = puVar20;
                    }
                    puVar46 = puVar9;
                    if ((int)puVar52[(int)*puVar9] < (int)puVar52[(int)*puVar42]) {
                      puVar46 = puVar42;
                    }
                  }
                  local_8f0 = puVar32;
                  if ((int)puVar52[(int)*puVar32] < (int)puVar52[(int)*puVar33]) {
                    local_8f0 = puVar33;
                  }
                  bucket_B = local_868;
                  if ((int)puVar52[(int)*puVar46] < (int)puVar52[(int)*local_8f0]) {
                    if ((int)puVar52[(int)*puVar32] < (int)puVar52[(int)*puVar33]) {
                      puVar33 = puVar32;
                    }
                    local_8f0 = puVar46;
                    if ((int)puVar52[(int)*puVar46] < (int)puVar52[(int)*puVar33]) {
                      local_8f0 = puVar33;
                    }
                  }
                }
                uVar50 = *puVar8;
                *puVar8 = *local_8f0;
                *local_8f0 = uVar50;
                uVar50 = puVar52[(int)*puVar8];
                tr_partition((int *)puVar52,(int *)puVar8,(int *)(puVar8 + 1),(int *)puVar7,
                             (int **)&local_8f0,(int **)&local_8b8,uVar50);
                puVar19 = (uchar *)((long)local_8b8 - (long)local_8f0 >> 2);
                SA = (int *)local_8b0;
                if (local_8d0 == puVar19) {
                  uVar50 = (uint)local_8d0;
                  if ((int)local_924 < (int)uVar50) {
                    if (iVar26 == 0) {
                      if (-1 < (int)uVar12) {
                        auStack_820[uVar17 * 8] = 0xffffffff;
                      }
                      iVar35 = iVar35 + uVar50;
                      if (iVar39 < 0) {
                        __assert_fail("0 <= ssize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xba28,
                                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                     );
                      }
                      goto joined_r0x0018caad;
                    }
                    local_924 = local_924 + (uint)local_8e0;
                    iVar26 = iVar26 + -1;
                  }
                  if (uVar50 < 0x10000) {
                    if (uVar50 < 0x100) {
                      uVar14 = lg_table[(ulong)local_8d0 & 0xff];
                    }
                    else {
                      uVar14 = lg_table[(ulong)local_8d0 >> 8 & 0xff] + 8;
                    }
                  }
                  else if (uVar50 < 0x1000000) {
                    uVar14 = *(int *)((long)lg_table + (ulong)(uVar50 >> 0xe & 0x3fc)) + 0x10;
                  }
                  else {
                    uVar14 = lg_table[uVar50 >> 0x18] + 0x18;
                  }
                  local_924 = local_924 - uVar50;
                  puVar52 = puVar52 + lVar40;
                  goto LAB_0018b9df;
                }
                uVar13 = 0xffffffff;
                uVar48 = (uint)puVar19;
                if (puVar1[(int)*local_8f0] != uVar50) {
                  if (uVar48 < 0x10000) {
                    if (uVar48 < 0x100) {
                      uVar13 = lg_table[(ulong)puVar19 & 0xff];
                    }
                    else {
                      uVar13 = lg_table[(ulong)puVar19 >> 8 & 0xff] + 8;
                    }
                  }
                  else if (uVar48 < 0x1000000) {
                    uVar13 = *(int *)((long)lg_table + (ulong)(uVar48 >> 0xe & 0x3fc)) + 0x10;
                  }
                  else {
                    uVar13 = lg_table[uVar48 >> 0x18] + 0x18;
                  }
                }
                if (puVar8 < local_8f0) {
                  puVar9 = puVar8;
                  do {
                    puVar1[(int)*puVar9] =
                         (int)((ulong)((long)local_8f0 - (long)local_8b0) >> 2) - 1;
                    puVar9 = puVar9 + 1;
                  } while (puVar9 < local_8f0);
                }
                if ((local_8b8 < puVar7) && (local_8f0 < local_8b8)) {
                  puVar9 = local_8f0;
                  do {
                    puVar1[(int)*puVar9] =
                         (int)((ulong)((long)local_8b8 - (long)local_8b0) >> 2) - 1;
                    puVar9 = puVar9 + 1;
                  } while (puVar9 < local_8b8);
                }
                uVar14 = uVar14 - 1;
                if (1 < (long)puVar19) {
                  if ((int)local_924 < (int)uVar48) {
                    if (iVar26 == 0) {
                      iVar35 = iVar35 + uVar48;
                      goto LAB_0018c0b3;
                    }
                    local_924 = local_924 + (uint)local_8e0;
                    iVar26 = iVar26 + -1;
                  }
                  local_924 = local_924 - uVar48;
                  lVar18 = (long)local_8f0 - (long)puVar8 >> 2;
                  lVar37 = (long)puVar7 - (long)local_8b8 >> 2;
                  if (lVar37 < lVar18) {
                    if (lVar18 <= (long)puVar19) {
                      if (lVar37 < 2) {
                        if (lVar18 < 2) {
                          puVar52 = puVar52 + lVar40;
                          puVar7 = local_8b8;
                          puVar8 = local_8f0;
                          uVar14 = uVar13;
                        }
                        else {
                          if (0x3f < iVar39) {
                            __assert_fail("ssize < STACK_SIZE",
                                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                          ,0xb9f9,
                                          "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                         );
                          }
                          lVar18 = (long)iVar39;
                          local_848[lVar18 * 4 + 2] = (ulong)(puVar52 + lVar40);
                          local_848[lVar18 * 4 + 3] = (ulong)local_8f0;
                          *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8b8;
                          auStack_820[lVar18 * 8] = uVar13;
                          uVar29 = (ulong)(iVar39 + 1);
                          auStack_820[lVar18 * 8 + 1] = uVar12;
                          puVar7 = local_8f0;
                        }
                      }
                      else {
                        if (0x3f < iVar39) {
                          __assert_fail("ssize < STACK_SIZE",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0xb9f5,
                                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                       );
                        }
                        lVar18 = (long)iVar39;
                        local_848[lVar18 * 4 + 2] = (ulong)(puVar52 + lVar40);
                        local_848[lVar18 * 4 + 3] = (ulong)local_8f0;
                        *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8b8;
                        auStack_820[lVar18 * 8] = uVar13;
                        auStack_820[lVar18 * 8 + 1] = uVar12;
                        if (iVar39 == 0x3f) {
                          __assert_fail("ssize < STACK_SIZE",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0xb9f6,
                                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                       );
                        }
                        alStack_818[lVar18 * 4] = (long)puVar52;
                        alStack_818[lVar18 * 4 + 1] = (long)puVar8;
                        *(uint **)(auStack_800 + lVar18 * 8 + -2) = local_8f0;
                        auStack_800[lVar18 * 8] = uVar14;
                        uVar50 = iVar39 + 2;
                        auStack_800[lVar18 * 8 + 1] = uVar12;
LAB_0018d367:
                        uVar29 = (ulong)uVar50;
                        puVar8 = local_8b8;
                      }
                      goto LAB_0018b9df;
                    }
                    if (lVar37 <= (long)puVar19) {
                      if (lVar37 < 2) {
                        if (0x3f < iVar39) {
                          __assert_fail("ssize < STACK_SIZE",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0xba04,
                                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                       );
                        }
                        lVar18 = (long)iVar39;
                        local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                        local_848[lVar18 * 4 + 3] = (ulong)puVar8;
                        *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8f0;
LAB_0018d3d0:
                        auStack_820[(long)iVar39 * 8] = uVar14;
                        uVar29 = (ulong)(iVar39 + 1);
                        auStack_820[(long)iVar39 * 8 + 1] = uVar12;
                        puVar52 = puVar52 + lVar40;
                        puVar7 = local_8b8;
                        puVar8 = local_8f0;
                        uVar14 = uVar13;
                      }
                      else {
                        if (0x3f < iVar39) {
                          __assert_fail("ssize < STACK_SIZE",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0xba00,
                                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                       );
                        }
                        lVar18 = (long)iVar39;
                        local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                        local_848[lVar18 * 4 + 3] = (ulong)puVar8;
                        *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8f0;
                        auStack_820[lVar18 * 8] = uVar14;
                        auStack_820[lVar18 * 8 + 1] = uVar12;
                        if (iVar39 == 0x3f) {
                          __assert_fail("ssize < STACK_SIZE",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0xba01,
                                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                       );
                        }
                        alStack_818[lVar18 * 4] = (long)(puVar52 + lVar40);
                        alStack_818[lVar18 * 4 + 1] = (long)local_8f0;
                        *(uint **)(auStack_800 + lVar18 * 8 + -2) = local_8b8;
                        auStack_800[lVar18 * 8] = uVar13;
                        auStack_800[lVar18 * 8 + 1] = uVar12;
                        puVar8 = local_8b8;
LAB_0018d27f:
                        uVar29 = (ulong)(iVar39 + 2);
                      }
                      goto LAB_0018b9df;
                    }
                    if (0x3f < iVar39) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xba08,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    lVar18 = (long)iVar39;
                    local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                    local_848[lVar18 * 4 + 3] = (ulong)puVar8;
                    *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8f0;
                    auStack_820[lVar18 * 8] = uVar14;
                    auStack_820[lVar18 * 8 + 1] = uVar12;
                    if (iVar39 == 0x3f) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xba09,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    alStack_818[lVar18 * 4] = (long)puVar52;
                    alStack_818[lVar18 * 4 + 1] = (long)local_8b8;
                    *(uint **)(auStack_800 + lVar18 * 8 + -2) = puVar7;
                  }
                  else {
                    if (lVar37 <= (long)puVar19) {
                      if (lVar18 < 2) {
                        if (1 < lVar37) {
                          if (0x3f < iVar39) {
                            __assert_fail("ssize < STACK_SIZE",
                                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                          ,0xb9df,
                                          "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                         );
                          }
                          lVar18 = (long)iVar39;
                          local_848[lVar18 * 4 + 2] = (ulong)(puVar52 + lVar40);
                          local_848[lVar18 * 4 + 3] = (ulong)local_8f0;
                          *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8b8;
                          auStack_820[lVar18 * 8] = uVar13;
                          uVar50 = iVar39 + 1;
                          auStack_820[lVar18 * 8 + 1] = uVar12;
                          goto LAB_0018d367;
                        }
                        puVar52 = puVar52 + lVar40;
                        puVar7 = local_8b8;
                        puVar8 = local_8f0;
                        uVar14 = uVar13;
                      }
                      else {
                        if (0x3f < iVar39) {
                          __assert_fail("ssize < STACK_SIZE",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0xb9db,
                                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                       );
                        }
                        lVar18 = (long)iVar39;
                        local_848[lVar18 * 4 + 2] = (ulong)(puVar52 + lVar40);
                        local_848[lVar18 * 4 + 3] = (ulong)local_8f0;
                        *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8b8;
                        auStack_820[lVar18 * 8] = uVar13;
                        auStack_820[lVar18 * 8 + 1] = uVar12;
                        if (iVar39 == 0x3f) {
                          __assert_fail("ssize < STACK_SIZE",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0xb9dc,
                                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                       );
                        }
                        alStack_818[lVar18 * 4] = (long)puVar52;
                        alStack_818[lVar18 * 4 + 1] = (long)local_8b8;
                        *(uint **)(auStack_800 + lVar18 * 8 + -2) = puVar7;
                        auStack_800[lVar18 * 8] = uVar14;
                        uVar29 = (ulong)(iVar39 + 2);
                        auStack_800[lVar18 * 8 + 1] = uVar12;
                        puVar7 = local_8f0;
                      }
                      goto LAB_0018b9df;
                    }
                    if (lVar18 <= (long)puVar19) {
                      if (lVar18 < 2) {
                        if (0x3f < iVar39) {
                          __assert_fail("ssize < STACK_SIZE",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0xb9ea,
                                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                       );
                        }
                        lVar18 = (long)iVar39;
                        local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                        local_848[lVar18 * 4 + 3] = (ulong)local_8b8;
                        *(uint **)(auStack_820 + lVar18 * 8 + -2) = puVar7;
                        goto LAB_0018d3d0;
                      }
                      if (0x3f < iVar39) {
                        __assert_fail("ssize < STACK_SIZE",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xb9e6,
                                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                     );
                      }
                      lVar18 = (long)iVar39;
                      local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                      local_848[lVar18 * 4 + 3] = (ulong)local_8b8;
                      *(uint **)(auStack_820 + lVar18 * 8 + -2) = puVar7;
                      auStack_820[lVar18 * 8] = uVar14;
                      auStack_820[lVar18 * 8 + 1] = uVar12;
                      if (iVar39 == 0x3f) {
                        __assert_fail("ssize < STACK_SIZE",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xb9e7,
                                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                     );
                      }
                      alStack_818[lVar18 * 4] = (long)(puVar52 + lVar40);
                      alStack_818[lVar18 * 4 + 1] = (long)local_8f0;
                      *(uint **)(auStack_800 + lVar18 * 8 + -2) = local_8b8;
                      auStack_800[lVar18 * 8] = uVar13;
                      auStack_800[lVar18 * 8 + 1] = uVar12;
                      puVar7 = local_8f0;
                      goto LAB_0018d27f;
                    }
                    if (0x3f < iVar39) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb9ee,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    lVar18 = (long)iVar39;
                    local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                    local_848[lVar18 * 4 + 3] = (ulong)local_8b8;
                    *(uint **)(auStack_820 + lVar18 * 8 + -2) = puVar7;
                    auStack_820[lVar18 * 8] = uVar14;
                    auStack_820[lVar18 * 8 + 1] = uVar12;
                    if (iVar39 == 0x3f) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb9ef,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    alStack_818[lVar18 * 4] = (long)puVar52;
                    alStack_818[lVar18 * 4 + 1] = (long)puVar8;
                    *(uint **)(auStack_800 + lVar18 * 8 + -2) = local_8f0;
                  }
                  auStack_800[(long)iVar39 * 8] = uVar14;
                  uVar29 = (ulong)(iVar39 + 2);
                  auStack_800[(long)iVar39 * 8 + 1] = uVar12;
                  puVar52 = puVar52 + lVar40;
                  puVar7 = local_8b8;
                  puVar8 = local_8f0;
                  uVar14 = uVar13;
                  goto LAB_0018b9df;
                }
LAB_0018c0b3:
                if ((4 < (long)local_8b8 - (long)local_8f0) && (-1 < (int)uVar12)) {
                  auStack_820[uVar17 * 8] = 0xffffffff;
                }
                lVar18 = (long)local_8f0 - (long)puVar8 >> 2;
                lVar37 = (long)puVar7 - (long)local_8b8 >> 2;
                if (lVar37 < lVar18) {
                  if (lVar37 < 2) {
                    puVar7 = local_8f0;
                    if (lVar18 < 2) {
                      if (iVar39 < 0) {
                        __assert_fail("0 <= ssize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xba1f,
                                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                     );
                      }
                      goto joined_r0x0018caad;
                    }
                  }
                  else {
                    if (0x3f < iVar39) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xba1a,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    lVar18 = (long)iVar39;
                    local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                    local_848[lVar18 * 4 + 3] = (ulong)puVar8;
                    *(uint **)(auStack_820 + lVar18 * 8 + -2) = local_8f0;
                    auStack_820[lVar18 * 8] = uVar14;
                    uVar29 = (ulong)(iVar39 + 1);
                    auStack_820[lVar18 * 8 + 1] = uVar12;
                    puVar8 = local_8b8;
                  }
                  goto LAB_0018b9df;
                }
                if (1 < lVar18) {
                  if (0x3f < iVar39) {
                    __assert_fail("ssize < STACK_SIZE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xba11,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  lVar18 = (long)iVar39;
                  local_848[lVar18 * 4 + 2] = (ulong)puVar52;
                  local_848[lVar18 * 4 + 3] = (ulong)local_8b8;
                  *(uint **)(auStack_820 + lVar18 * 8 + -2) = puVar7;
                  auStack_820[lVar18 * 8] = uVar14;
                  uVar29 = (ulong)(iVar39 + 1);
                  auStack_820[lVar18 * 8 + 1] = uVar12;
                  puVar7 = local_8f0;
                  goto LAB_0018b9df;
                }
                puVar8 = local_8b8;
                if (1 < lVar37) goto LAB_0018b9df;
                if (iVar39 < 0) {
                  __assert_fail("0 <= ssize",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xba16,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
              }
joined_r0x0018caad:
              if (iVar39 != 0) {
                uVar29 = (ulong)(iVar39 - 1);
                puVar52 = (uint *)local_848[uVar29 * 4 + 2];
                puVar7 = *(uint **)(auStack_820 + uVar29 * 8 + -2);
                uVar17 = (ulong)auStack_820[uVar29 * 8 + 1];
                puVar8 = (uint *)local_848[uVar29 * 4 + 3];
                uVar14 = auStack_820[uVar29 * 8];
                goto LAB_0018b9df;
              }
LAB_0018d44c:
              uVar17 = local_8d8;
              puVar52 = local_858;
              if (iVar35 == 0) {
                uVar29 = (ulong)((long)local_888 - (long)local_890) >> 2;
              }
              else {
                local_8c4 = local_8c4 + iVar35;
                uVar29 = 0;
              }
            }
          }
          iVar35 = (int)uVar17;
          local_888 = local_890;
        } while (local_890 < puVar1);
        uVar14 = (uint)uVar29;
        if (uVar14 != 0) {
          local_890[(int)uVar14] = uVar14;
        }
      } while ((local_8c4 != 0) &&
              (puVar52 = (uint *)((long)puVar52 + local_880), (int)local_894 < *SA));
    }
    if (0 < iVar35) {
      bVar10 = local_8e8[uVar22];
      uVar17 = local_8e0;
      do {
        uVar14 = (int)(uint)uVar22 >> 0x1f & (uint)uVar22;
        uVar29 = uVar22;
        bVar11 = bVar10;
        do {
          uVar29 = uVar29 - 1;
          uVar13 = (uint)uVar22;
          uVar12 = uVar14;
          uVar50 = uVar14 - 1;
          bVar10 = bVar11;
          if ((int)uVar13 < 1) break;
          bVar10 = local_8e8[uVar29 & 0xffffffff];
          uVar50 = uVar13 - 1;
          uVar22 = (ulong)uVar50;
          bVar54 = bVar11 <= bVar10;
          uVar12 = uVar13;
          bVar11 = bVar10;
        } while (bVar54);
        if ((int)uVar13 < 1) {
          uVar22 = 0xffffffff;
        }
        else {
          uVar14 = uVar12 - 2;
          uVar22 = (ulong)uVar14;
          if (uVar12 != 1) {
            bVar11 = bVar10;
            do {
              iVar26 = (int)uVar22;
              bVar10 = local_8e8[uVar22];
              if (bVar11 < bVar10) goto LAB_0018d549;
              uVar22 = (ulong)(iVar26 - 1);
              bVar11 = bVar10;
            } while (0 < iVar26);
            uVar22 = (ulong)(((int)uVar14 >> 0x1f & uVar14) - 1);
          }
LAB_0018d549:
          uVar14 = -uVar12;
          if (1 < (int)(uVar50 - (int)uVar22)) {
            uVar14 = uVar50;
          }
          if (uVar50 == 0) {
            uVar14 = uVar50;
          }
          iVar26 = (int)uVar17;
          uVar17 = (ulong)(iVar26 - 1);
          ((uint *)SA)[(int)puVar1[(long)iVar26 + -1]] = uVar14;
        }
      } while (-1 < (int)uVar22);
    }
    bucket_B[0xffff] = iVar35;
    uVar17 = 0xfe;
    do {
      uVar14 = (uint)uVar17;
      uVar22 = (ulong)(local_860[uVar17 + 1] - 1);
      uVar29 = 0xff;
      do {
        iVar26 = (int)uVar22;
        uVar50 = (uint)uVar29;
        uVar13 = uVar50 << 8 | uVar14;
        uVar12 = iVar26 - bucket_B[(int)uVar13];
        uVar22 = (ulong)uVar12;
        bucket_B[(int)uVar13] = iVar26;
        iVar26 = bucket_B[(int)(uVar50 | uVar14 << 8)];
        if (iVar26 <= (int)local_878) {
          uVar22 = (ulong)(int)uVar12;
          lVar40 = (long)(int)local_878 + 1;
          local_878 = (ulong)(iVar26 - 1);
          do {
            ((uint *)SA)[uVar22] = ((uint *)SA)[lVar40 + -1];
            uVar22 = uVar22 - 1;
            lVar40 = lVar40 + -1;
          } while (iVar26 < lVar40);
        }
        uVar29 = (ulong)(uVar50 - 1);
      } while (uVar17 < uVar29);
      uVar12 = uVar14 << 8 | uVar14;
      bucket_B[(int)(uVar14 << 8 | uVar14 + 1)] = ((int)uVar22 - bucket_B[(int)uVar12]) + 1;
      bucket_B[(int)uVar12] = (int)uVar22;
      bVar54 = uVar17 != 0;
      uVar17 = uVar17 - 1;
    } while (bVar54);
  }
  return (uint)local_8e0;
code_r0x0018b4f8:
  if ((int)uVar12 < (int)uVar50) {
    do {
      puVar32 = puVar32 + -1;
      uVar50 = *puVar32;
      puVar33 = puVar7 + -1;
      do {
        *puVar32 = *puVar33;
        puVar46 = puVar32 + -1;
        puVar32 = puVar32 + -1;
        *puVar33 = *puVar46;
        puVar33 = puVar33 + -1;
      } while (puVar20 <= puVar33);
      *puVar32 = uVar50;
      uVar50 = (int)uVar29 + ~uVar12;
      uVar29 = (ulong)uVar50;
    } while ((int)uVar12 < (int)uVar50);
  }
  else {
    do {
      uVar12 = *puVar20;
      puVar20 = puVar20 + 1;
      puVar33 = puVar7;
      do {
        puVar46 = puVar20;
        puVar46[-1] = *puVar33;
        *puVar33 = *puVar46;
        puVar33 = puVar33 + 1;
        puVar20 = puVar46 + 1;
      } while (puVar33 < puVar32);
      *puVar46 = uVar12;
      uVar12 = (int)uVar17 + ~uVar50;
      uVar17 = (ulong)uVar12;
    } while ((int)uVar50 < (int)uVar12);
  }
  if (((int)uVar17 < 1) || ((int)uVar29 < 1)) goto LAB_0018b5a2;
  goto LAB_0018b4ef;
}

Assistant:

static
int
sort_typeBstar(const unsigned char *T, int *SA,
               int *bucket_A, int *bucket_B,
               int n, int openMP) {
  int *PAb, *ISAb, *buf;
#ifdef LIBBSC_OPENMP
  int *curbuf;
  int l;
#endif
  int i, j, k, t, m, bufsize;
  int c0, c1;
#ifdef LIBBSC_OPENMP
  int d0, d1;
#endif
  (void)openMP;

  /* Initialize bucket arrays. */
  for(i = 0; i < BUCKET_A_SIZE; ++i) { bucket_A[i] = 0; }
  for(i = 0; i < BUCKET_B_SIZE; ++i) { bucket_B[i] = 0; }

  /* Count the number of occurrences of the first one or two characters of each
     type A, B and B* suffix. Moreover, store the beginning position of all
     type B* suffixes into the array SA. */
  for(i = n - 1, m = n, c0 = T[n - 1]; 0 <= i;) {
    /* type A suffix. */
    do { ++BUCKET_A(c1 = c0); } while((0 <= --i) && ((c0 = T[i]) >= c1));
    if(0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(c0, c1);
      SA[--m] = i;
      /* type B suffix. */
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) {
        ++BUCKET_B(c0, c1);
      }
    }
  }
  m = n - m;
/*
note:
  A type B* suffix is lexicographically smaller than a type B suffix that
  begins with the same first two characters.
*/

  /* Calculate the index of start/end point of each bucket. */
  for(c0 = 0, i = 0, j = 0; c0 < ALPHABET_SIZE; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0) = i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for(c1 = c0 + 1; c1 < ALPHABET_SIZE; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if(0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    PAb = SA + n - m; ISAb = SA + m;
    for(i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
#ifdef LIBBSC_OPENMP
    if (openMP)
    {
        buf = SA + m;
        c0 = ALPHABET_SIZE - 2, c1 = ALPHABET_SIZE - 1, j = m;
#pragma omp parallel default(shared) private(bufsize, curbuf, k, l, d0, d1)
        {
          bufsize = (n - (2 * m)) / omp_get_num_threads();
          curbuf = buf + omp_get_thread_num() * bufsize;
          k = 0;
          for(;;) {
            #pragma omp critical(sssort_lock)
            {
              if(0 < (l = j)) {
                d0 = c0, d1 = c1;
                do {
                  k = BUCKET_BSTAR(d0, d1);
                  if(--d1 <= d0) {
                    d1 = ALPHABET_SIZE - 1;
                    if(--d0 < 0) { break; }
                  }
                } while(((l - k) <= 1) && (0 < (l = k)));
                c0 = d0, c1 = d1, j = k;
              }
            }
            if(l == 0) { break; }
            sssort(T, PAb, SA + k, SA + l,
                   curbuf, bufsize, 2, n, *(SA + k) == (m - 1));
          }
        }
    }
    else
    {
        buf = SA + m, bufsize = n - (2 * m);
        for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
          for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
            i = BUCKET_BSTAR(c0, c1);
            if(1 < (j - i)) {
              sssort(T, PAb, SA + i, SA + j,
                     buf, bufsize, 2, n, *(SA + i) == (m - 1));
            }
          }
        }
    }
#else
    buf = SA + m, bufsize = n - (2 * m);
    for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
        i = BUCKET_BSTAR(c0, c1);
        if(1 < (j - i)) {
          sssort(T, PAb, SA + i, SA + j,
                 buf, bufsize, 2, n, *(SA + i) == (m - 1));
        }
      }
    }
#endif

    /* Compute ranks of type B* substrings. */
    for(i = m - 1; 0 <= i; --i) {
      if(0 <= SA[i]) {
        j = i;
        do { ISAb[SA[i]] = i; } while((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if(i <= 0) { break; }
      }
      j = i;
      do { ISAb[SA[i] = ~SA[i]] = j; } while(SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using trsort. */
    trsort(ISAb, SA, m, 1);

    /* Set the sorted order of type B* suffixes. */
    for(i = n - 1, j = m, c0 = T[n - 1]; 0 <= i;) {
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) >= c1); --i, c1 = c0) { }
      if(0 <= i) {
        t = i;
        for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) { }
        SA[ISAb[--j]] = ((t == 0) || (1 < (t - i))) ? t : ~t;
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    BUCKET_B(ALPHABET_SIZE - 1, ALPHABET_SIZE - 1) = n; /* end point */
    for(c0 = ALPHABET_SIZE - 2, k = m - 1; 0 <= c0; --c0) {
      i = BUCKET_A(c0 + 1) - 1;
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for(i = t, j = BUCKET_BSTAR(c0, c1);
            j <= k;
            --i, --k) { SA[i] = SA[k]; }
      }
      BUCKET_BSTAR(c0, c0 + 1) = i - BUCKET_B(c0, c0) + 1; /* start point */
      BUCKET_B(c0, c0) = i; /* end point */
    }
  }

  return m;
}